

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::InvalidateState(DeviceContextVkImpl *this)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  Char *Message;
  undefined1 local_640 [8];
  string msg;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL> local_618;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined1 local_30 [8];
  string _msg;
  DeviceContextVkImpl *this_local;
  
  _msg.field_2._8_8_ = this;
  if ((this->m_State).NumCommands != 0) {
    FormatString<char[104]>
              ((string *)local_30,
               (char (*) [104])
               "Invalidating context that has outstanding commands in it. Call Flush() to submit commands for execution"
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::InvalidateState
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  local_48 = 0;
  uStack_47 = 0;
  uStack_46 = 0;
  uStack_45 = 0;
  uStack_44 = 0;
  local_40 = 0x7fffffff;
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  msg.field_2._8_8_ = &local_618;
  do {
    uVar3 = msg.field_2._8_8_;
    ResourceBindInfo::ResourceBindInfo((ResourceBindInfo *)msg.field_2._8_8_);
    msg.field_2._8_8_ = uVar3 + 0x1f0;
  } while ((undefined1 *)msg.field_2._8_8_ != &local_48);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::operator=
            (&this->m_BindInfo,&local_618);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::~array(&local_618);
  this->m_vkRenderPass = (VkRenderPass)0x0;
  this->m_vkFramebuffer = (VkFramebuffer)0x0;
  std::
  unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ::reset(&this->m_DynamicRenderingInfo,(pointer)0x0);
  bVar2 = VulkanUtilities::VulkanCommandBuffer::IsInRenderScope(&this->m_CommandBuffer);
  if (bVar2) {
    FormatString<char[49]>
              ((string *)local_640,(char (*) [49])"Invalidating context with unfinished render pass"
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"InvalidateState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x677);
    std::__cxx11::string::~string((string *)local_640);
  }
  VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  return;
}

Assistant:

void DeviceContextVkImpl::InvalidateState()
{
    if (m_State.NumCommands != 0)
        LOG_WARNING_MESSAGE("Invalidating context that has outstanding commands in it. Call Flush() to submit commands for execution");

    TDeviceContextBase::InvalidateState();
    m_State         = {};
    m_BindInfo      = {};
    m_vkRenderPass  = VK_NULL_HANDLE;
    m_vkFramebuffer = VK_NULL_HANDLE;
    m_DynamicRenderingInfo.reset();

    VERIFY(!m_CommandBuffer.IsInRenderScope(), "Invalidating context with unfinished render pass");
    m_CommandBuffer.Reset();
}